

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

ostream * pstack::operator<<(ostream *os,
                            JSON<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                            *json)

{
  ostream *poVar1;
  string local_58;
  Escape local_38;
  JSON<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *local_18;
  JSON<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *json_local;
  ostream *os_local;
  
  local_18 = json;
  json_local = (JSON<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                *)os;
  poVar1 = std::operator<<(os,"\"");
  std::__cxx11::string::string((string *)&local_58,local_18->object);
  Escape::Escape(&local_38,&local_58);
  poVar1 = operator<<(poVar1,&local_38);
  poVar1 = std::operator<<(poVar1,"\"");
  Escape::~Escape(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<std::string, C> &json) {
   return os << "\"" << Escape(json.object) << "\"";
}